

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  int iVar1;
  uint *puVar2;
  uint *in_RDX;
  char *in_RSI;
  uint *in_RDI;
  _ht *pEntry;
  uint h;
  uint count;
  HashElem *elem;
  uint local_30;
  uint local_2c;
  HashElem *local_28;
  HashElem *local_8;
  
  if (*(long *)(in_RDI + 4) == 0) {
    local_30 = 0;
    local_28 = *(HashElem **)(in_RDI + 2);
    local_2c = in_RDI[1];
  }
  else {
    local_30 = strHash(in_RSI);
    local_30 = local_30 % *in_RDI;
    puVar2 = (uint *)(*(long *)(in_RDI + 4) + (ulong)local_30 * 0x10);
    local_28 = *(HashElem **)(puVar2 + 2);
    local_2c = *puVar2;
  }
  if (in_RDX != (uint *)0x0) {
    *in_RDX = local_30;
  }
  while( true ) {
    if (local_2c == 0) {
      local_8 = &findElementWithHash::nullElement;
      return local_8;
    }
    iVar1 = sqlite3StrICmp(local_28->pKey,in_RSI);
    if (iVar1 == 0) break;
    local_28 = local_28->next;
    local_2c = local_2c - 1;
  }
  return local_28;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  unsigned int count;            /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){
      return elem;
    }
    elem = elem->next;
    count--;
  }
  return &nullElement;
}